

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemotelyControlledSampler.cpp
# Opt level: O3

void __thiscall
jaegertracing::samplers::RemotelyControlledSampler::updateRateLimitingOrProbabilisticSampler
          (RemotelyControlledSampler *this,SamplingStrategyResponse *response)

{
  runtime_error *this_00;
  shared_ptr<jaegertracing::samplers::Sampler> sampler;
  ostringstream oss;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  string local_1b8 [32];
  undefined1 local_198 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_190 [46];
  
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((byte)response->__isset & 1) == 0) {
    if (((byte)response->__isset & 2) == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Unsupported sampling strategy type ",0x23);
      sampling_manager::thrift::operator<<((ostream *)local_198,&response->strategyType);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1b8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_198 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<jaegertracing::samplers::RateLimitingSampler,std::allocator<jaegertracing::samplers::RateLimitingSampler>,short_const&>
              (local_190,(RateLimitingSampler **)local_198,
               (allocator<jaegertracing::samplers::RateLimitingSampler> *)local_1b8,
               &(response->rateLimitingSampling).maxTracesPerSecond);
  }
  else {
    local_198 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<jaegertracing::samplers::ProbabilisticSampler,std::allocator<jaegertracing::samplers::ProbabilisticSampler>,double_const&>
              (local_190,(ProbabilisticSampler **)local_198,
               (allocator<jaegertracing::samplers::ProbabilisticSampler> *)local_1b8,
               &(response->probabilisticSampling).samplingRate);
  }
  _Stack_1c0._M_pi = local_190[0]._M_pi;
  (this->_sampler).super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_198;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_sampler).
              super___shared_ptr<jaegertracing::samplers::Sampler,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&_Stack_1c0);
  if (_Stack_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
  }
  return;
}

Assistant:

void RemotelyControlledSampler::updateRateLimitingOrProbabilisticSampler(
    const SamplingStrategyResponse& response)
{
    std::shared_ptr<Sampler> sampler;
    if (response.__isset.probabilisticSampling) {
        sampler = std::make_shared<ProbabilisticSampler>(
            response.probabilisticSampling.samplingRate);
    }
    else if (response.__isset.rateLimitingSampling) {
        sampler = std::make_shared<RateLimitingSampler>(
            response.rateLimitingSampling.maxTracesPerSecond);
    }
    else {
        std::ostringstream oss;
        oss << "Unsupported sampling strategy type " << response.strategyType;
        throw std::runtime_error(oss.str());
    }
    _sampler = sampler;
}